

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

void Abc_NtkOrderObjsByName(Abc_Ntk_t *pNtk,int fComb)

{
  long *plVar1;
  long *plVar2;
  char *pcVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  
  if (pNtk->nObjCounts[8] == pNtk->vBoxes->nSize) {
    pVVar4 = pNtk->vPis;
    if (0 < pVVar4->nSize) {
      lVar5 = 0;
      do {
        plVar1 = (long *)pVVar4->pArray[lVar5];
        pcVar3 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar1 + 0x18),(int)plVar1[2]);
        plVar1[8] = (long)pcVar3;
        lVar5 = lVar5 + 1;
        pVVar4 = pNtk->vPis;
      } while (lVar5 < pVVar4->nSize);
    }
    pVVar4 = pNtk->vPos;
    if (0 < pVVar4->nSize) {
      lVar5 = 0;
      do {
        plVar1 = (long *)pVVar4->pArray[lVar5];
        pcVar3 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar1 + 0x18),(int)plVar1[2]);
        plVar1[8] = (long)pcVar3;
        lVar5 = lVar5 + 1;
        pVVar4 = pNtk->vPos;
      } while (lVar5 < pVVar4->nSize);
    }
    pVVar4 = pNtk->vBoxes;
    if (0 < pVVar4->nSize) {
      lVar5 = 0;
      do {
        plVar1 = (long *)pVVar4->pArray[lVar5];
        plVar2 = *(long **)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8);
        pcVar3 = Nm_ManCreateUniqueName(*(Nm_Man_t **)(*plVar2 + 0x18),(int)plVar2[2]);
        plVar1[8] = (long)pcVar3;
        lVar5 = lVar5 + 1;
        pVVar4 = pNtk->vBoxes;
      } while (lVar5 < pVVar4->nSize);
    }
    qsort(pNtk->vPis->pArray,(long)pNtk->vPis->nSize,8,Abc_NodeCompareNames);
    qsort(pNtk->vPos->pArray,(long)pNtk->vPos->nSize,8,Abc_NodeCompareNames);
    if (fComb != 0) {
      qsort(pNtk->vBoxes->pArray,(long)pNtk->vBoxes->nSize,8,Abc_NodeCompareNames);
    }
    Abc_NtkOrderCisCos(pNtk);
    pVVar4 = pNtk->vPis;
    if (0 < pVVar4->nSize) {
      lVar5 = 0;
      do {
        *(undefined8 *)((long)pVVar4->pArray[lVar5] + 0x40) = 0;
        lVar5 = lVar5 + 1;
        pVVar4 = pNtk->vPis;
      } while (lVar5 < pVVar4->nSize);
    }
    pVVar4 = pNtk->vPos;
    if (0 < pVVar4->nSize) {
      lVar5 = 0;
      do {
        *(undefined8 *)((long)pVVar4->pArray[lVar5] + 0x40) = 0;
        lVar5 = lVar5 + 1;
        pVVar4 = pNtk->vPos;
      } while (lVar5 < pVVar4->nSize);
    }
    pVVar4 = pNtk->vBoxes;
    if (0 < pVVar4->nSize) {
      lVar5 = 0;
      do {
        *(undefined8 *)((long)pVVar4->pArray[lVar5] + 0x40) = 0;
        lVar5 = lVar5 + 1;
        pVVar4 = pNtk->vBoxes;
      } while (lVar5 < pVVar4->nSize);
    }
    return;
  }
  __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                ,0x148,"void Abc_NtkOrderObjsByName(Abc_Ntk_t *, int)");
}

Assistant:

void Abc_NtkOrderObjsByName( Abc_Ntk_t * pNtk, int fComb )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );
    // temporarily store the names in the copy field
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Abc_ObjName(pObj);
    Abc_NtkForEachPo( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Abc_ObjName(pObj);
    Abc_NtkForEachBox( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Abc_ObjName(Abc_ObjFanout0(pObj));
    // order objects alphabetically
    qsort( (void *)Vec_PtrArray(pNtk->vPis), (size_t)Vec_PtrSize(pNtk->vPis), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareNames );
    qsort( (void *)Vec_PtrArray(pNtk->vPos), (size_t)Vec_PtrSize(pNtk->vPos), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareNames );
    // if the comparison if combinational (latches as PIs/POs), order them too
    if ( fComb )
        qsort( (void *)Vec_PtrArray(pNtk->vBoxes), (size_t)Vec_PtrSize(pNtk->vBoxes), sizeof(Abc_Obj_t *), 
            (int (*)(const void *, const void *)) Abc_NodeCompareNames );
    // order CIs/COs first PIs/POs(Asserts) then latches
    Abc_NtkOrderCisCos( pNtk );
    // clean the copy fields
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->pCopy = NULL;
    Abc_NtkForEachPo( pNtk, pObj, i )
        pObj->pCopy = NULL;
    Abc_NtkForEachBox( pNtk, pObj, i )
        pObj->pCopy = NULL;
}